

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeIntegerFormat
          (ParsedPatternInfo *this,UErrorCode *status)

{
  ParserState *this_00;
  ParsedSubpatternInfo *pPVar1;
  uint64_t uVar2;
  bool bVar3;
  UChar32 UVar4;
  uint uVar5;
  UErrorCode UVar6;
  
  pPVar1 = this->currentSubpattern;
  this_00 = &this->state;
  do {
    UVar4 = ParserState::peek(this_00);
    if (UVar4 - 0x30U < 10) {
      if (0 < pPVar1->integerAtSigns) {
LAB_00265e34:
        UVar6 = U_FMT_PARSE_ERROR_START;
        goto LAB_00265e39;
      }
      pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
      pPVar1->groupingSizes = pPVar1->groupingSizes + 1;
      pPVar1->integerNumerals = pPVar1->integerNumerals + 1;
      pPVar1->integerTotal = pPVar1->integerTotal + 1;
      bVar3 = DecimalQuantity::isZero(&pPVar1->rounding);
      if ((!bVar3) || (UVar4 = ParserState::peek(this_00), UVar4 != 0x30)) {
        UVar4 = ParserState::peek(this_00);
        DecimalQuantity::appendDigit(&pPVar1->rounding,(char)UVar4 + -0x30,0,true);
      }
    }
    else {
      if (UVar4 == 0x23) {
        if (0 < pPVar1->integerNumerals) goto LAB_00265e34;
        pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
        pPVar1->groupingSizes = pPVar1->groupingSizes + 1;
        if (pPVar1->integerAtSigns < 1) {
          pPVar1->integerLeadingHashSigns = pPVar1->integerLeadingHashSigns + 1;
        }
        else {
          pPVar1->integerTrailingHashSigns = pPVar1->integerTrailingHashSigns + 1;
        }
      }
      else {
        if (UVar4 != 0x40) {
          if (UVar4 == 0x2c) {
            pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
            pPVar1->groupingSizes = pPVar1->groupingSizes << 0x10;
            goto LAB_00265e0e;
          }
          uVar2 = pPVar1->groupingSizes;
          UVar6 = U_FMT_PARSE_ERROR_START;
          if (((short)uVar2 == 0 && (uint)uVar2 < 0xffff0000) ||
             (UVar6 = U_PATTERN_SYNTAX_ERROR, (short)(uVar2 >> 0x20) != -1 && (uint)uVar2 < 0x10000)
             ) {
LAB_00265e39:
            *status = UVar6;
          }
          return;
        }
        UVar6 = U_FMT_PARSE_ERROR_START;
        if ((0 < pPVar1->integerNumerals) || (0 < pPVar1->integerTrailingHashSigns))
        goto LAB_00265e39;
        pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
        pPVar1->groupingSizes = pPVar1->groupingSizes + 1;
        pPVar1->integerAtSigns = pPVar1->integerAtSigns + 1;
      }
      pPVar1->integerTotal = pPVar1->integerTotal + 1;
    }
LAB_00265e0e:
    uVar5 = ParserState::peek(this_00);
    (this->state).offset = ((this->state).offset - (uint)(uVar5 < 0x10000)) + 2;
  } while( true );
}

Assistant:

void ParsedPatternInfo::consumeIntegerFormat(UErrorCode& status) {
    // Convenience reference:
    ParsedSubpatternInfo& result = *currentSubpattern;

    while (true) {
        switch (state.peek()) {
            case u',':
                result.widthExceptAffixes += 1;
                result.groupingSizes <<= 16;
                break;

            case u'#':
                if (result.integerNumerals > 0) {
                    state.toParseException(u"# cannot follow 0 before decimal point");
                    status = U_UNEXPECTED_TOKEN;
                    return;
                }
                result.widthExceptAffixes += 1;
                result.groupingSizes += 1;
                if (result.integerAtSigns > 0) {
                    result.integerTrailingHashSigns += 1;
                } else {
                    result.integerLeadingHashSigns += 1;
                }
                result.integerTotal += 1;
                break;

            case u'@':
                if (result.integerNumerals > 0) {
                    state.toParseException(u"Cannot mix 0 and @");
                    status = U_UNEXPECTED_TOKEN;
                    return;
                }
                if (result.integerTrailingHashSigns > 0) {
                    state.toParseException(u"Cannot nest # inside of a run of @");
                    status = U_UNEXPECTED_TOKEN;
                    return;
                }
                result.widthExceptAffixes += 1;
                result.groupingSizes += 1;
                result.integerAtSigns += 1;
                result.integerTotal += 1;
                break;

            case u'0':
            case u'1':
            case u'2':
            case u'3':
            case u'4':
            case u'5':
            case u'6':
            case u'7':
            case u'8':
            case u'9':
                if (result.integerAtSigns > 0) {
                    state.toParseException(u"Cannot mix @ and 0");
                    status = U_UNEXPECTED_TOKEN;
                    return;
                }
                result.widthExceptAffixes += 1;
                result.groupingSizes += 1;
                result.integerNumerals += 1;
                result.integerTotal += 1;
                if (!result.rounding.isZero() || state.peek() != u'0') {
                    result.rounding.appendDigit(static_cast<int8_t>(state.peek() - u'0'), 0, true);
                }
                break;

            default:
                goto after_outer;
        }
        state.next(); // consume the symbol
    }

    after_outer:
    // Disallow patterns with a trailing ',' or with two ',' next to each other
    auto grouping1 = static_cast<int16_t> (result.groupingSizes & 0xffff);
    auto grouping2 = static_cast<int16_t> ((result.groupingSizes >> 16) & 0xffff);
    auto grouping3 = static_cast<int16_t> ((result.groupingSizes >> 32) & 0xffff);
    if (grouping1 == 0 && grouping2 != -1) {
        state.toParseException(u"Trailing grouping separator is invalid");
        status = U_UNEXPECTED_TOKEN;
        return;
    }
    if (grouping2 == 0 && grouping3 != -1) {
        state.toParseException(u"Grouping width of zero is invalid");
        status = U_PATTERN_SYNTAX_ERROR;
        return;
    }
}